

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file_format.cc
# Opt level: O1

string * detect_format(string *__return_storage_ptr__,ifstream *infile,string *filename)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint __val;
  uint __val_00;
  istream *piVar5;
  GraphFileError *pGVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  ulong uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  smatch match;
  string word;
  stringstream line_stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  string local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8 [4];
  ios_base local_138 [264];
  
  local_358._M_string_length = 0;
  local_358.field_2._M_local_buf[0] = '\0';
  cVar3 = (char)infile;
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)infile + -0x18) + cVar3);
  piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)infile,(string *)&local_358,cVar1);
  if ((((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) ||
     (local_358._M_string_length == 0)) {
    pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
    local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"unable to read file to detect file format","");
    GraphFileError::GraphFileError(pGVar6,filename,local_1b8,true);
    __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::dimacs_comment_abi_cxx11_ == '\0')
  {
    iVar4 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 dimacs_comment_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                  dimacs_comment_abi_cxx11_,"c(\\s.*)?",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                    dimacs_comment_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           dimacs_comment_abi_cxx11_);
    }
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::dimacs_problem_abi_cxx11_ == '\0')
  {
    iVar4 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 dimacs_problem_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                  dimacs_problem_abi_cxx11_,"p\\s+(edge|col)\\s+(\\d+)\\s+(\\d+)?\\s*",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                    dimacs_problem_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           dimacs_problem_abi_cxx11_);
    }
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_header_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 lad_header_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_header_abi_cxx11_,
                 "\\d+",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_header_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           lad_header_abi_cxx11_);
    }
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_zero_labelled_line_abi_cxx11_
      == '\0') {
    iVar4 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 lad_zero_labelled_line_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                  lad_zero_labelled_line_abi_cxx11_,"0 \\d+",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                    lad_zero_labelled_line_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           lad_zero_labelled_line_abi_cxx11_);
    }
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_zero_unlabelled_line_abi_cxx11_
      == '\0') {
    iVar4 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 lad_zero_unlabelled_line_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                  lad_zero_unlabelled_line_abi_cxx11_,"0",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                    lad_zero_unlabelled_line_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           lad_zero_unlabelled_line_abi_cxx11_);
    }
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_line_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 lad_line_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_line_abi_cxx11_,
                 "\\d+\\s+(\\d+\\s+)*\\d+\\s*",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_line_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           lad_line_abi_cxx11_);
    }
  }
  if (detect_format(std::ifstream&,std::__cxx11::string_const&)::csv_problem_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                                 csv_problem_abi_cxx11_);
    if (iVar4 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&detect_format(std::ifstream&,std::__cxx11::string_const&)::csv_problem_abi_cxx11_,
                 "\\S+[,>]\\S+",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                    csv_problem_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&detect_format(std::ifstream&,std::__cxx11::string_const&)::
                           csv_problem_abi_cxx11_);
    }
  }
  local_2f8.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8._M_begin._M_current = (char *)0x0;
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_358._M_dataplus._M_p,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_358._M_dataplus._M_p + local_358._M_string_length),&local_2f8,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                      dimacs_comment_abi_cxx11_,0);
  if (bVar2) {
    while( true ) {
      bVar2 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )local_358._M_dataplus._M_p,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(local_358._M_dataplus._M_p + local_358._M_string_length),&local_2f8,
                         &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                          dimacs_comment_abi_cxx11_,0);
      if (!bVar2) break;
      cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)infile + -0x18) + cVar3);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)infile,(string *)&local_358,cVar1);
      if ((((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) ||
         (local_358._M_string_length == 0)) {
        pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
        local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"unable to auto-detect file format (entirely c lines?)","");
        GraphFileError::GraphFileError(pGVar6,filename,local_1b8,true);
        __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
    }
    bVar2 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_358._M_dataplus._M_p,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_358._M_dataplus._M_p + local_358._M_string_length),&local_2f8,
                       &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                        dimacs_problem_abi_cxx11_,0);
    if (!bVar2) {
      pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
      local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,
                 "unable to auto-detect file format (c line not followed by a p line?)","");
      GraphFileError::GraphFileError(pGVar6,filename,local_1b8,true);
      __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"dimacs","");
    goto LAB_0012fc8b;
  }
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_358._M_dataplus._M_p,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_358._M_dataplus._M_p + local_358._M_string_length),&local_2f8,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                      dimacs_problem_abi_cxx11_,0);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"dimacs","");
    goto LAB_0012fc8b;
  }
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_358._M_dataplus._M_p,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_358._M_dataplus._M_p + local_358._M_string_length),&local_2f8,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                      lad_header_abi_cxx11_,0);
  if (!bVar2) {
    bVar2 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_358._M_dataplus._M_p,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_358._M_dataplus._M_p + local_358._M_string_length),&local_2f8,
                       &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                        csv_problem_abi_cxx11_,0);
    if (!bVar2) {
      pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
      local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,
                 "unable to auto-detect file format (no recognisable header found)","");
      GraphFileError::GraphFileError(pGVar6,filename,local_1b8,true);
      __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"csv","");
    goto LAB_0012fc8b;
  }
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_358,"0");
  if (iVar4 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"lad","");
    goto LAB_0012fc8b;
  }
  cVar3 = std::ios::widen((char)*(undefined8 *)(*(long *)infile + -0x18) + cVar3);
  piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)infile,(string *)&local_358,cVar3);
  if ((((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) ||
     (local_358._M_string_length == 0)) {
    pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
    local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"unable to auto-detect file format (number followed by nothing)",
               "");
    GraphFileError::GraphFileError(pGVar6,filename,local_1b8,true);
    __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_358._M_dataplus._M_p,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_358._M_dataplus._M_p + local_358._M_string_length),&local_2f8,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                      lad_zero_labelled_line_abi_cxx11_,0);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"labelledlad","");
    goto LAB_0012fc8b;
  }
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_358._M_dataplus._M_p,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_358._M_dataplus._M_p + local_358._M_string_length),&local_2f8,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::
                      lad_zero_unlabelled_line_abi_cxx11_,0);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"lad","");
    goto LAB_0012fc8b;
  }
  bVar2 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_358._M_dataplus._M_p,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(local_358._M_dataplus._M_p + local_358._M_string_length),&local_2f8,
                     &detect_format(std::ifstream&,std::__cxx11::string_const&)::lad_line_abi_cxx11_
                     ,0);
  if (!bVar2) {
    pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
    local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,
               "unable to auto-detect file format (looks like lad, but no edge line found)","");
    GraphFileError::GraphFileError(pGVar6,filename,local_1b8,true);
    __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_1b8,(string *)&local_358,_S_out|_S_in);
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  while( true ) {
    piVar5 = std::operator>>((istream *)local_1b8,(string *)&local_298);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
               &local_298);
  }
  if ((ulong)((long)local_318.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_318.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,
               "unable to auto-detect file format (not enough words in a lad line)","");
    GraphFileError::GraphFileError(pGVar6,filename,&local_338,true);
    __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  __val = std::__cxx11::stoi(local_318.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,(size_t *)0x0,10);
  if ((ulong)((long)local_318.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_318.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
  }
  __val_00 = std::__cxx11::stoi(local_318.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0,10);
  uVar7 = (long)local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_318.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  uVar9 = (ulong)(__val + 1);
  if (uVar7 == uVar9) {
    if (uVar7 == __val_00 * 2 + 2) {
      if (uVar7 != uVar9) goto LAB_0012fbf9;
      goto LAB_001301bd;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"lad","");
  }
  else {
LAB_0012fbf9:
    if (uVar7 != __val_00 * 2 + 2) {
      if (uVar7 != uVar9) goto LAB_00130228;
LAB_001301bd:
      if (uVar7 == __val_00 * 2 + 2) {
        pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_338,"unable to auto-detect between lad or labelledlad","");
        GraphFileError::GraphFileError(pGVar6,filename,&local_338,true);
        __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
      }
LAB_00130228:
      pGVar6 = (GraphFileError *)__cxa_allocate_exception(0x30);
      std::__cxx11::to_string
                (&local_238,
                 (long)local_318.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_318.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      std::operator+(&local_218,"unable to auto-detect file format (looks like lad, but got ",
                     &local_238);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_218," items on a line with first two elements ");
      local_2b8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p == paVar10) {
        local_2b8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      }
      else {
        local_2b8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2b8._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::to_string(&local_258,__val);
      std::operator+(&local_1f8,&local_2b8,&local_258);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1f8," and ");
      local_2d8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p == paVar10) {
        local_2d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      }
      else {
        local_2d8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2d8._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::to_string(&local_278,__val_00);
      std::operator+(&local_1d8,&local_2d8,&local_278);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1d8,")");
      local_338._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p == paVar10) {
        local_338.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_338.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      }
      else {
        local_338.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_338._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      GraphFileError::GraphFileError(pGVar6,filename,&local_338,true);
      __cxa_throw(pGVar6,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"labelledlad","");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                             local_298.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_0012fc8b:
  if (local_2f8.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f8.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,
                    CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                             local_358.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto detect_format(ifstream & infile, const string & filename) -> string
{
    string line;
    if (! getline(infile, line) || line.empty())
        throw GraphFileError{filename, "unable to read file to detect file format", true};

    static const regex
        dimacs_comment{R"(c(\s.*)?)"},
        dimacs_problem{R"(p\s+(edge|col)\s+(\d+)\s+(\d+)?\s*)"},
        lad_header{R"(\d+)"},
        lad_zero_labelled_line{R"(0 \d+)"},
        lad_zero_unlabelled_line{R"(0)"},
        lad_line{R"(\d+\s+(\d+\s+)*\d+\s*)"},
        csv_problem{R"(\S+[,>]\S+)"};

    smatch match;
    if (regex_match(line, match, dimacs_comment)) {
        while (regex_match(line, match, dimacs_comment)) {
            // looks like a DIMACS comment, ignore
            if (! getline(infile, line) || line.empty())
                throw GraphFileError{filename, "unable to auto-detect file format (entirely c lines?)", true};
        }
        if (! regex_match(line, match, dimacs_problem))
            throw GraphFileError{filename, "unable to auto-detect file format (c line not followed by a p line?)", true};
        return "dimacs";
    }
    else if (regex_match(line, match, dimacs_problem))
        return "dimacs";
    else if (regex_match(line, match, lad_header)) {
        if ("0" == line)
            return "lad";

        // got to figure out whether we're labelled or not
        if (! getline(infile, line) || line.empty())
            throw GraphFileError{filename, "unable to auto-detect file format (number followed by nothing)", true};
        if (regex_match(line, match, lad_zero_labelled_line))
            return "labelledlad";
        else if (regex_match(line, match, lad_zero_unlabelled_line))
            return "lad";
        else if (regex_match(line, match, lad_line)) {
            stringstream line_stream{line};
            vector<string> words;
            string word;
            while (line_stream >> word)
                words.emplace_back(word);

            if (words.size() < 2)
                throw GraphFileError{filename, "unable to auto-detect file format (not enough words in a lad line)", true};

            unsigned items_if_lad = stoi(words.at(0)), items_if_labelledlad = stoi(words.at(1));
            if (words.size() == items_if_lad + 1 && ! (words.size() == (2 * items_if_labelledlad) + 2))
                return "lad";
            else if (! (words.size() == items_if_lad + 1) && (words.size() == (2 * items_if_labelledlad) + 2))
                return "labelledlad";
            else if ((words.size() == items_if_lad + 1) && (words.size() == (2 * items_if_labelledlad) + 2))
                throw GraphFileError{filename, "unable to auto-detect between lad or labelledlad", true};
            else
                throw GraphFileError{filename, "unable to auto-detect file format (looks like lad, but got " + to_string(words.size()) + " items on a line with first two elements " + to_string(items_if_lad) + " and " + to_string(items_if_labelledlad) + ")", true};
        }
        else
            throw GraphFileError{filename, "unable to auto-detect file format (looks like lad, but no edge line found)", true};
    }
    else if (regex_match(line, match, csv_problem))
        return "csv";

    throw GraphFileError{filename, "unable to auto-detect file format (no recognisable header found)", true};
}